

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

Type __thiscall
QtPromise::resolve<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>&>
          (QtPromise *this,
          vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *value)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>_>
  extraout_RDX;
  Type TVar1;
  anon_class_8_1_a8c68091 local_20;
  vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *local_18;
  vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *value_local;
  
  local_20.value = value;
  local_18 = value;
  value_local = (vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)this
  ;
  QPromise<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>>::
  QPromise<QtPromise::resolve<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>&>(std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>&)::_lambda(QtPromise::QPromiseResolve<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>>&&,QtPromise::QPromiseReject<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>>&&)_1_>
            ((QPromise<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>>
              *)this,&local_20);
  TVar1.
  super_QPromiseBase<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  .m_d.d = extraout_RDX.d;
  TVar1.
  super_QPromiseBase<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  ._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar1.
               super_QPromiseBase<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  ;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}